

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SaveIniSettingsToDisk(char *ini_filename)

{
  char *__ptr;
  FILE *__s;
  size_t ini_data_size;
  
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    ini_data_size = 0;
    __ptr = SaveIniSettingsToMemory(&ini_data_size);
    __s = fopen(ini_filename,"wt");
    if (__s != (FILE *)0x0) {
      fwrite(__ptr,1,ini_data_size,__s);
      ImFileClose((ImFileHandle)__s);
    }
  }
  return;
}

Assistant:

void ImGui::SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    size_t ini_data_size = 0;
    const char* ini_data = SaveIniSettingsToMemory(&ini_data_size);
    ImFileHandle f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    ImFileWrite(ini_data, sizeof(char), ini_data_size, f);
    ImFileClose(f);
}